

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_getter_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type,sexp index)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sexp psVar3;
  sexp in_RCX;
  sexp in_RDX;
  sexp unaff_RBX;
  sexp in_RSI;
  sexp in_RDI;
  sexp in_R8;
  sexp in_R9;
  sexp_proc1 unaff_R14;
  sexp in_stack_ffffffffffffff88;
  sexp_uint_t in_stack_ffffffffffffff90;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  sexp local_48;
  sexp in_stack_ffffffffffffffe0;
  
  local_48 = in_R8;
  if ((((ulong)in_R8 & 3) == 0) && (in_R8->tag == 1)) {
    local_48 = (sexp)((ulong)(in_R8->value).type.tag << 1 | 1);
  }
  if ((((ulong)local_48 & 1) == 1) &&
     (auVar1._8_8_ = (long)local_48 >> 0x3f, auVar1._0_8_ = (ulong)local_48 & 0xfffffffffffffffe,
     -1 < SUB168(auVar1 / SEXT816(2),0))) {
    if ((((ulong)in_R9 & 1) == 1) &&
       (auVar2._8_8_ = (long)in_R9 >> 0x3f, auVar2._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe,
       -1 < SUB168(auVar2 / SEXT816(2),0))) {
      psVar3 = sexp_make_opcode((sexp)0x0,in_R9,local_48,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                                local_48,in_RCX,in_RDX,in_RSI,in_RDI,in_stack_ffffffffffffffe0,
                                unaff_RBX,unaff_R14);
    }
    else {
      psVar3 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                   in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  else {
    psVar3 = sexp_type_exception(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return psVar3;
}

Assistant:

sexp sexp_make_getter_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type, sexp index) {
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  if ((! sexp_fixnump(type))  || (sexp_unbox_fixnum(type) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, type);
  if ((! sexp_fixnump(index)) || (sexp_unbox_fixnum(index) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, index);
  return
    sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_GETTER),
                     sexp_make_fixnum(SEXP_OP_SLOT_REF), SEXP_ONE, SEXP_ZERO,
                     type, SEXP_ZERO, SEXP_ZERO, type, index, NULL);
}